

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_strtable_next2(upb_strtable *t,upb_StringView *key,upb_value *val,intptr_t *iter)

{
  intptr_t *piVar1;
  upb_tabent *puVar2;
  upb_tabent *puVar3;
  char *pcVar4;
  upb_value uVar5;
  uint local_44;
  upb_tabkey *puStack_40;
  uint32_t len;
  upb_tabent *ent;
  size_t tab_idx;
  intptr_t *iter_local;
  upb_value *val_local;
  upb_StringView *key_local;
  upb_strtable *t_local;
  
  tab_idx = (size_t)iter;
  iter_local = (intptr_t *)val;
  val_local = (upb_value *)key;
  key_local = (upb_StringView *)t;
  puVar2 = (upb_tabent *)next(&t->t,*iter);
  ent = puVar2;
  puVar3 = (upb_tabent *)upb_table_size((upb_table *)key_local);
  if (puVar2 < puVar3) {
    puStack_40 = (upb_tabkey *)(key_local[1].size + (long)ent * 0x18);
    pcVar4 = upb_tabstr(*puStack_40,&local_44);
    piVar1 = iter_local;
    val_local->val = (uint64_t)pcVar4;
    val_local[1].val = (ulong)local_44;
    uVar5 = _upb_value_val(puStack_40[1]);
    *piVar1 = uVar5.val;
    *(upb_tabent **)tab_idx = ent;
  }
  return puVar2 < puVar3;
}

Assistant:

bool upb_strtable_next2(const upb_strtable* t, upb_StringView* key,
                        upb_value* val, intptr_t* iter) {
  size_t tab_idx = next(&t->t, *iter);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    uint32_t len;
    key->data = upb_tabstr(ent->key, &len);
    key->size = len;
    *val = _upb_value_val(ent->val.val);
    *iter = tab_idx;
    return true;
  }

  return false;
}